

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::setLogCallback
          (Highs *this,_func_void_HighsLogType_char_ptr_void_ptr *user_log_callback,
          void *user_log_callback_data)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  string *alt_method_name;
  string *in_stack_ffffffffffffff88;
  Highs *in_stack_ffffffffffffff90;
  undefined1 local_39 [33];
  undefined8 local_18;
  undefined8 local_10;
  
  alt_method_name = (string *)local_39;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_39 + 1),"setLogCallback",(allocator *)alt_method_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"setCallback",(allocator *)&stack0xffffffffffffff8f)
  ;
  deprecationMessage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  *(undefined8 *)(in_RDI + 0xe48) = local_10;
  *(undefined8 *)(in_RDI + 0xe50) = local_18;
  return kOk;
}

Assistant:

HighsStatus Highs::setLogCallback(void (*user_log_callback)(HighsLogType,
                                                            const char*, void*),
                                  void* user_log_callback_data) {
  deprecationMessage("setLogCallback", "setCallback");
  options_.log_options.user_log_callback = user_log_callback;
  options_.log_options.user_log_callback_data = user_log_callback_data;
  return HighsStatus::kOk;
}